

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall
gl4cts::CopyImage::FunctionalTest::calculateDimmensions
          (FunctionalTest *this,GLenum target,GLuint level,GLuint width,GLuint height,
          GLuint *out_widths,GLuint *out_heights,GLuint *out_depths)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  GLuint i;
  ulong uVar6;
  long lVar7;
  uint auStack_20 [5];
  GLuint factors [3];
  
  uVar2 = 1;
  if ((int)target < 0x8c1a) {
    if ((target != 0x806f) && (target != 0x8c18)) goto LAB_0087e53e;
  }
  else if ((target != 0x8c1a) && ((target != 0x9102 && (target != 0x9009)))) goto LAB_0087e53e;
  uVar2 = 0xc;
LAB_0087e53e:
  if (-1 < (int)level) {
    uVar4 = 100;
    lVar7 = (ulong)level + 1;
    do {
      auStack_20[lVar7] = uVar4;
      uVar4 = uVar4 * 2;
      lVar5 = lVar7 + -1;
      bVar1 = 0 < lVar7;
      lVar7 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  if (level + 1 < 3) {
    uVar6 = (ulong)(level + 1);
    uVar4 = 0x32;
    do {
      uVar6 = uVar6 + 1;
      auStack_20[uVar6] = uVar4;
      uVar4 = uVar4 >> 1;
    } while ((int)uVar6 != 3);
  }
  lVar7 = 0;
  do {
    uVar4 = auStack_20[lVar7 + 1];
    out_widths[lVar7] = (uVar4 * width) / 100;
    out_heights[lVar7] = (uVar4 * height) / 100;
    uVar3 = uVar2;
    if (target == 0x806f) {
      uVar3 = (uVar4 * 0xc) / 100;
    }
    out_depths[lVar7] = uVar3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  return;
}

Assistant:

void FunctionalTest::calculateDimmensions(GLenum target, GLuint level, GLuint width, GLuint height, GLuint* out_widths,
										  GLuint* out_heights, GLuint* out_depths) const
{
	GLuint		 divide = 100;
	GLuint		 factors[FUNCTIONAL_TEST_N_LEVELS];
	GLuint		 factor			= divide;
	const bool   is_multi_layer = Utils::isTargetMultilayer(target);
	const GLuint n_layers		= (true == is_multi_layer) ? FUNCTIONAL_TEST_N_LAYERS : 1;

	for (GLint i = (GLint)level; i >= 0; --i)
	{
		factors[i] = factor;
		factor *= 2;
	}

	factor = divide / 2;
	for (GLuint i = level + 1; i < FUNCTIONAL_TEST_N_LEVELS; ++i)
	{
		factors[i] = factor;
		factor /= 2;
	}

	for (GLuint i = 0; i < FUNCTIONAL_TEST_N_LEVELS; ++i)
	{
		out_widths[i]  = width * factors[i] / divide;
		out_heights[i] = height * factors[i] / divide;

		if (GL_TEXTURE_3D == target)
		{
			out_depths[i] = FUNCTIONAL_TEST_N_LAYERS * factors[i] / divide;
		}
		else
		{
			out_depths[i] = n_layers;
		}
	}
}